

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O2

bool tinyexr::hufDecode(longlong *hcode,HufDec *hdecod,char *in,int ni,int rlc,int no,
                       unsigned_short *out)

{
  unsigned_short *puVar1;
  byte bVar2;
  unsigned_short uVar3;
  int iVar4;
  char cVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  unsigned_short *puVar14;
  byte *pbVar15;
  ulong uVar16;
  unsigned_short *outb;
  
  puVar1 = out + no;
  pbVar15 = (byte *)(in + (ni + 7) / 8);
  iVar6 = 0;
  uVar16 = 0;
  puVar14 = out;
  do {
    if (pbVar15 <= in) {
      uVar16 = (long)uVar16 >> (sbyte)(-ni & 7U);
      iVar6 = iVar6 - (-ni & 7U);
      do {
        lVar10 = (long)puVar14 - (long)out;
        while( true ) {
          if (iVar6 < 1) {
            return lVar10 >> 1 == (long)no;
          }
          iVar4 = *(int *)(&hdecod->field_0x0 +
                          (((uint)(uVar16 << (0xeU - (char)iVar6 & 0x3f)) & 0x3fff) << 4));
          if (iVar4 << 0x18 == 0) {
            return false;
          }
          iVar6 = iVar6 - ((iVar4 << 0x18) >> 0x18);
          if (iVar4 >> 8 == rlc) break;
          if (puVar1 <= puVar14) {
            return false;
          }
          *puVar14 = (unsigned_short)((uint)iVar4 >> 8);
          puVar14 = puVar14 + 1;
          lVar10 = lVar10 + 2;
        }
        if (iVar6 < 8) {
          bVar2 = *in;
          in = (char *)((byte *)in + 1);
          uVar16 = uVar16 << 8 | (ulong)bVar2;
          iVar6 = iVar6 + 8;
        }
        iVar6 = iVar6 + -8;
        uVar8 = (long)uVar16 >> ((byte)iVar6 & 0x3f);
        if (puVar1 < puVar14 + (uVar8 & 0xff)) {
          return false;
        }
        uVar3 = puVar14[-1];
        while (cVar5 = (char)uVar8, uVar8 = (ulong)(byte)(cVar5 - 1), cVar5 != '\0') {
          *puVar14 = uVar3;
          puVar14 = puVar14 + 1;
        }
      } while( true );
    }
    bVar2 = *in;
    in = (char *)((byte *)in + 1);
    uVar16 = uVar16 << 8 | (ulong)bVar2;
    iVar6 = iVar6 + 8;
    while (0xd < iVar6) {
      uVar8 = (ulong)(((uint)((long)uVar16 >> ((char)iVar6 - 0xeU & 0x3f)) & 0x3fff) << 4);
      iVar4 = *(int *)(&hdecod->field_0x0 + uVar8);
      uVar13 = iVar4 >> 8;
      if (iVar4 << 0x18 == 0) {
        lVar10 = *(long *)((long)&hdecod->p + uVar8);
        if (lVar10 == 0) {
          return false;
        }
        uVar8 = 0;
        if (0 < (int)uVar13) {
          uVar8 = (ulong)uVar13;
        }
        for (uVar11 = 0; uVar11 != uVar8; uVar11 = uVar11 + 1) {
          iVar4 = *(int *)(lVar10 + uVar11 * 4);
          uVar12 = (uint)hcode[iVar4];
          uVar9 = uVar12 & 0x3f;
          iVar7 = iVar6;
          for (; (iVar7 < (int)uVar9 && (in < pbVar15)); in = (char *)((byte *)in + 1)) {
            uVar16 = uVar16 << 8 | (ulong)(byte)*in;
            iVar7 = iVar7 + 8;
          }
          if (((int)uVar9 <= iVar7) &&
             (hcode[iVar4] >> 6 ==
              (~(-1L << (sbyte)uVar9) & (long)uVar16 >> ((char)iVar7 - (sbyte)uVar9 & 0x3fU)))) {
            iVar6 = iVar7 - (uVar12 & 0x3f);
            uVar8 = uVar11;
            if (iVar4 == rlc) {
              if (iVar6 < 8) {
                bVar2 = *in;
                in = (char *)((byte *)in + 1);
                uVar16 = uVar16 << 8 | (ulong)bVar2;
                iVar6 = (iVar7 - (uVar12 & 0x3f)) + 8;
              }
              iVar6 = iVar6 + -8;
              uVar11 = (long)uVar16 >> ((byte)iVar6 & 0x3f);
              if (puVar1 < puVar14 + (uVar11 & 0xff)) {
                return false;
              }
              uVar3 = puVar14[-1];
              while (cVar5 = (char)uVar11, uVar11 = (ulong)(byte)(cVar5 - 1), cVar5 != '\0') {
                *puVar14 = uVar3;
                puVar14 = puVar14 + 1;
              }
            }
            else {
              if (puVar1 <= puVar14) {
                return false;
              }
              *puVar14 = (unsigned_short)iVar4;
              puVar14 = puVar14 + 1;
            }
            break;
          }
          iVar6 = iVar7;
        }
        if ((uint)uVar8 == uVar13) {
          return false;
        }
      }
      else {
        iVar6 = iVar6 - ((iVar4 << 0x18) >> 0x18);
        if (uVar13 == rlc) {
          if (iVar6 < 8) {
            bVar2 = *in;
            in = (char *)((byte *)in + 1);
            uVar16 = uVar16 << 8 | (ulong)bVar2;
            iVar6 = iVar6 + 8;
          }
          iVar6 = iVar6 + -8;
          uVar8 = (long)uVar16 >> ((byte)iVar6 & 0x3f);
          if (puVar1 < puVar14 + (uVar8 & 0xff)) {
            return false;
          }
          uVar3 = puVar14[-1];
          while (cVar5 = (char)uVar8, uVar8 = (ulong)(byte)(cVar5 - 1), cVar5 != '\0') {
            *puVar14 = uVar3;
            puVar14 = puVar14 + 1;
          }
        }
        else {
          if (puVar1 <= puVar14) {
            return false;
          }
          *puVar14 = (unsigned_short)((uint)iVar4 >> 8);
          puVar14 = puVar14 + 1;
        }
      }
    }
  } while( true );
}

Assistant:

bool hufDecode(const long long *hcode,  // i : encoding table
               const HufDec *hdecod,    // i : decoding table
               const char *in,          // i : compressed input buffer
               int ni,                  // i : input size (in bits)
               int rlc,                 // i : run-length code
               int no,                  // i : expected output size (in bytes)
               unsigned short *out)     //  o: uncompressed output buffer
{
  long long c = 0;
  int lc = 0;
  unsigned short *outb = out;
  unsigned short *oe = out + no;
  const char *ie = in + (ni + 7) / 8;  // input byte size

  //
  // Loop on input bytes
  //

  while (in < ie) {
    getChar(c, lc, in);

    //
    // Access decoding table
    //

    while (lc >= HUF_DECBITS) {
      const HufDec pl = hdecod[(c >> (lc - HUF_DECBITS)) & HUF_DECMASK];

      if (pl.len) {
        //
        // Get short code
        //

        lc -= pl.len;
        getCode(pl.lit, rlc, c, lc, in, out, oe);
      } else {
        if (!pl.p) {
          return false;
        }
        // invalidCode(); // wrong code

        //
        // Search long code
        //

        int j;

        for (j = 0; j < pl.lit; j++) {
          int l = hufLength(hcode[pl.p[j]]);

          while (lc < l && in < ie)  // get more bits
            getChar(c, lc, in);

          if (lc >= l) {
            if (hufCode(hcode[pl.p[j]]) ==
                ((c >> (lc - l)) & (((long long)(1) << l) - 1))) {
              //
              // Found : get long code
              //

              lc -= l;
              getCode(pl.p[j], rlc, c, lc, in, out, oe);
              break;
            }
          }
        }

        if (j == pl.lit) {
          return false;
          // invalidCode(); // Not found
        }
      }
    }
  }

  //
  // Get remaining (short) codes
  //

  int i = (8 - ni) & 7;
  c >>= i;
  lc -= i;

  while (lc > 0) {
    const HufDec pl = hdecod[(c << (HUF_DECBITS - lc)) & HUF_DECMASK];

    if (pl.len) {
      lc -= pl.len;
      getCode(pl.lit, rlc, c, lc, in, out, oe);
    } else {
      return false;
      // invalidCode(); // wrong (long) code
    }
  }

  if (out - outb != no) {
    return false;
  }
  // notEnoughData ();

  return true;
}